

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<short>::test_all_algorithms
          (DivideTest<short> *this,short denom,set_t<short> *tested_denom)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  short local_1a;
  
  p_Var3 = (tested_denom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(tested_denom->_M_t)._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      uVar2 = (undefined2)p_Var3[1]._M_color;
      if (denom <= (short)uVar2) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(short)uVar2 < denom];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && ((short)p_Var4[1]._M_color <= denom)) {
      return;
    }
  }
  local_1a = denom;
  test_many<(libdivide::Branching)0>(this,denom);
  test_many<(libdivide::Branching)1>(this,denom);
  std::_Rb_tree<short,short,std::_Identity<short>,std::less<short>,std::allocator<short>>::
  _M_insert_unique<short_const&>
            ((_Rb_tree<short,short,std::_Identity<short>,std::less<short>,std::allocator<short>> *)
             tested_denom,&local_1a);
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }